

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

void STAT_StartNewGame(char *mapname)

{
  int iVar1;
  FEpisode *pFVar2;
  ulong uVar3;
  
  if (LevelData.Count != 0) {
    TArray<OneLevel,_OneLevel>::DoDelete(&LevelData,0,LevelData.Count - 1);
    LevelData.Count = 0;
  }
  if ((deathmatch.Value == 0) && (multiplayer == false)) {
    pFVar2 = AllEpisodes.Array;
    for (uVar3 = (ulong)AllEpisodes.Count; uVar3 != 0; uVar3 = uVar3 - 1) {
      iVar1 = strcasecmp((pFVar2->mEpisodeMap).Chars,mapname);
      if (iVar1 == 0) {
        StartEpisode = pFVar2;
        return;
      }
      pFVar2 = pFVar2 + 1;
    }
  }
  StartEpisode = (FEpisode *)0x0;
  return;
}

Assistant:

void STAT_StartNewGame(const char *mapname)
{
	LevelData.Clear();
	if (!deathmatch && !multiplayer)
	{
		for(unsigned int j=0;j<AllEpisodes.Size();j++)
		{
			if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(mapname))
			{
				StartEpisode = &AllEpisodes[j];
				return;
			}
		}
	}
	StartEpisode = NULL;
}